

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall soul::StructuralParser::parseLogicalOr(StructuralParser *this)

{
  bool bVar1;
  Constant *args_2;
  Expression *args_3;
  pool_ref<soul::AST::Expression> a;
  Context context;
  Value local_70;
  
  a.object = parseLogicalAnd(this);
  while( true ) {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x275daf);
    if (!bVar1) break;
    getContext(&context,this);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&this->super_SOULTokeniser);
    soul::Value::Value(&local_70,true);
    args_2 = allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>(this,&context,&local_70);
    soul::Value::~Value(&local_70);
    args_3 = parseLogicalAnd(this);
    a.object = &allocate<soul::AST::TernaryOp,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::AST::Constant&,soul::AST::Expression&>
                          (this,&context,&a,args_2,args_3)->super_Expression;
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&context);
  }
  return a.object;
}

Assistant:

AST::Expression& parseLogicalOr()
    {
        for (pool_ref<AST::Expression> a = parseLogicalAnd();;)
        {
            if (! matches (Operator::logicalOr))
                return a;

            auto context = getContext();
            skip();
            auto& trueBranch = allocate<AST::Constant> (context, Value (true));
            auto& falseBranch = parseLogicalAnd();
            a = allocate<AST::TernaryOp> (context, a, trueBranch, falseBranch);
        }
    }